

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_scatter_gather.cpp
# Opt level: O0

TupleDataGatherFunction * duckdb::TupleDataCollection::GetGatherFunction(LogicalType *type)

{
  bool bVar1;
  PhysicalType PVar2;
  InternalException *this;
  TupleDataGatherFunction *in_RDI;
  bool in_stack_00000077;
  LogicalType *in_stack_00000078;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  *child_type;
  const_iterator __end3;
  const_iterator __begin3;
  child_list_t<LogicalType> *__range3;
  LogicalType new_type;
  TupleDataGatherFunction *result;
  undefined7 in_stack_fffffffffffffed8;
  LogicalTypeId in_stack_fffffffffffffedf;
  LogicalType *in_stack_fffffffffffffee0;
  allocator local_c9;
  string local_c8 [64];
  reference local_88;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  *local_80;
  __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>_>
  local_78;
  child_list_t<LogicalType> *local_70;
  undefined4 local_64;
  undefined1 local_29;
  LogicalType local_28;
  
  bVar1 = LogicalType::IsNested
                    ((LogicalType *)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
  if (bVar1) {
    bVar1 = TypeVisitor::Contains(in_stack_fffffffffffffee0,in_stack_fffffffffffffedf);
    if (bVar1) {
      ArrayType::ConvertToList(in_stack_00000078);
      local_29 = 0;
      TupleDataGatherFunction::TupleDataGatherFunction((TupleDataGatherFunction *)0x1646015);
      PVar2 = LogicalType::InternalType(&local_28);
      if (PVar2 == LIST) {
        in_RDI->function = TupleDataCastToArrayListGather;
        ListType::GetChildType(in_stack_fffffffffffffee0);
        TupleDataGetGatherFunctionInternal(in_stack_00000078,in_stack_00000077);
        ::std::
        vector<duckdb::TupleDataGatherFunction,_std::allocator<duckdb::TupleDataGatherFunction>_>::
        push_back((vector<duckdb::TupleDataGatherFunction,_std::allocator<duckdb::TupleDataGatherFunction>_>
                   *)in_stack_fffffffffffffee0,
                  (value_type *)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
        TupleDataGatherFunction::~TupleDataGatherFunction((TupleDataGatherFunction *)0x16460bf);
      }
      else {
        if (PVar2 != STRUCT) {
          this = (InternalException *)__cxa_allocate_exception(0x10);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_c8,"Unsupported type for TupleDataCollection::GetGatherFunction",
                     &local_c9);
          InternalException::InternalException
                    (this,(string *)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
          __cxa_throw(this,&InternalException::typeinfo,InternalException::~InternalException);
        }
        in_RDI->function = TupleDataCastToArrayStructGather;
        local_70 = StructType::GetChildTypes_abi_cxx11_(in_stack_fffffffffffffee0);
        local_78._M_current =
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
              *)::std::
                vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                         *)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
        local_80 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
                    *)::std::
                      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                      ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                             *)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>_>
                                   *)in_stack_fffffffffffffee0,
                                  (__normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>_>
                                   *)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8)),
              bVar1) {
          local_88 = __gnu_cxx::
                     __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>_>
                     ::operator*(&local_78);
          TupleDataGetGatherFunctionInternal(in_stack_00000078,in_stack_00000077);
          ::std::
          vector<duckdb::TupleDataGatherFunction,_std::allocator<duckdb::TupleDataGatherFunction>_>
          ::push_back((vector<duckdb::TupleDataGatherFunction,_std::allocator<duckdb::TupleDataGatherFunction>_>
                       *)in_stack_fffffffffffffee0,
                      (value_type *)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
          TupleDataGatherFunction::~TupleDataGatherFunction((TupleDataGatherFunction *)0x16461d9);
          __gnu_cxx::
          __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>_>
          ::operator++(&local_78);
        }
      }
      local_29 = 1;
      local_64 = 1;
      LogicalType::~LogicalType((LogicalType *)0x164630b);
    }
    else {
      TupleDataGetGatherFunctionInternal(in_stack_00000078,in_stack_00000077);
    }
  }
  else {
    TupleDataGetGatherFunctionInternal(in_stack_00000078,in_stack_00000077);
  }
  return in_RDI;
}

Assistant:

TupleDataGatherFunction TupleDataCollection::GetGatherFunction(const LogicalType &type) {
	if (!type.IsNested()) {
		return TupleDataGetGatherFunctionInternal(type, false);
	}

	if (TypeVisitor::Contains(type, LogicalTypeId::ARRAY)) {
		// Special case: we cant handle arrays yet, so we need to replace them with lists when gathering
		const auto new_type = ArrayType::ConvertToList(type);
		TupleDataGatherFunction result;
		// Theres only two cases: Either the array is within a struct, or it is within a list (or has now become a list)
		switch (new_type.InternalType()) {
		case PhysicalType::LIST:
			result.function = TupleDataCastToArrayListGather;
			result.child_functions.push_back(
			    TupleDataGetGatherFunctionInternal(ListType::GetChildType(new_type), true));
			return result;
		case PhysicalType::STRUCT:
			result.function = TupleDataCastToArrayStructGather;
			for (const auto &child_type : StructType::GetChildTypes(new_type)) {
				result.child_functions.push_back(TupleDataGetGatherFunctionInternal(child_type.second, false));
			}
			return result;
		default:
			throw InternalException("Unsupported type for TupleDataCollection::GetGatherFunction");
		}
	}
	return TupleDataGetGatherFunctionInternal(type, false);
}